

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O0

int killpara(int f,int n)

{
  int iVar1;
  int status;
  int lineno;
  int n_local;
  int f_local;
  
  if (n == 0) {
    n_local = 1;
  }
  else {
    iVar1 = findpara();
    if (iVar1 == 0) {
      n_local = 1;
    }
    else {
      gotobop(8,1);
      iVar1 = curwp->w_dotline;
      curwp->w_markp = curwp->w_dotp;
      curwp->w_marko = curwp->w_doto;
      gotoeop(8,n);
      n_local = killregion(8,1);
      if (n_local == 1) {
        curwp->w_dotline = iVar1;
        n_local = 1;
      }
    }
  }
  return n_local;
}

Assistant:

int
killpara(int f, int n)
{
	int	lineno, status;

	if (n == 0)
		return (TRUE);

	if (findpara() == FALSE)
		return (TRUE);

	/* go to the beginning of the paragraph */
	(void)gotobop(FFRAND, 1);

	/* take a note of the line number for after deletions and set mark */
	lineno = curwp->w_dotline;
	curwp->w_markp = curwp->w_dotp;
	curwp->w_marko = curwp->w_doto;

	(void)gotoeop(FFRAND, n);

	if ((status = killregion(FFRAND, 1)) != TRUE)
		return (status);

	curwp->w_dotline = lineno;
	return (TRUE);
}